

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_369d94::
DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
::RunTest(DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          *this,bool speedtest,bool needsaturation,int p_angle)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  *this_00;
  char (*val) [18];
  AssertHelper *this_01;
  Message *message;
  Message *pMVar4;
  int in_ECX;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  AssertionResult gtest_ar;
  int c;
  int r_2;
  int r_1;
  int r;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst_tst;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dst_ref;
  int dst_stride;
  int i_1;
  int i;
  unsigned_short sat;
  unsigned_short *left;
  unsigned_short *above;
  unsigned_short above_data [160];
  unsigned_short left_data [160];
  int tx;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  unsigned_short *in_stack_fffffffffffffbe8;
  allocator_type *in_stack_fffffffffffffbf0;
  Message *in_stack_fffffffffffffbf8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffc00;
  Type type;
  AssertHelper *in_stack_fffffffffffffc10;
  reference in_stack_fffffffffffffc70;
  unsigned_short *above_00;
  undefined1 *puVar5;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  uint uVar6;
  int in_stack_fffffffffffffcc8;
  AssertionResult local_328;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_300 [2];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_2d0;
  undefined4 local_2b8;
  int local_2b4;
  int local_2b0;
  ushort local_2aa;
  undefined1 *local_2a8;
  unsigned_short *local_2a0;
  ushort local_298 [16];
  unsigned_short auStack_278 [144];
  ushort local_158 [16];
  undefined1 auStack_138 [292];
  int local_14;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x58);
  local_14 = 0;
  local_10 = in_ECX;
  do {
    if (0x12 < local_14) {
      return;
    }
    *(int *)(in_RDI + 0x24) = ::tx_size_wide[(byte)(anonymous_namespace)::kTxSize[local_14]];
    *(int *)(in_RDI + 0x28) = ::tx_size_high[(byte)(anonymous_namespace)::kTxSize[local_14]];
    if (*(int *)(in_RDI + 0x18) == 0) {
      *(undefined4 *)(in_RDI + 0x20) = 0;
      *(undefined4 *)(in_RDI + 0x1c) = 0;
    }
    else {
      iVar3 = av1_use_intra_edge_upsample
                        (*(int *)(in_RDI + 0x24),*(int *)(in_RDI + 0x28),local_10 + -0x5a,0);
      *(int *)(in_RDI + 0x1c) = iVar3;
      iVar3 = av1_use_intra_edge_upsample
                        (*(int *)(in_RDI + 0x24),*(int *)(in_RDI + 0x28),local_10 + -0xb4,0);
      *(int *)(in_RDI + 0x20) = iVar3;
    }
    local_2a0 = auStack_278;
    local_2a8 = auStack_138;
    if ((local_a & 1) == 0) {
      for (local_2b4 = 0; local_2b4 < 0xa0; local_2b4 = local_2b4 + 1) {
        bVar1 = libaom_test::ACMRandom::Rand8
                          ((ACMRandom *)
                           CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        local_158[local_2b4] = (ushort)bVar1;
        bVar1 = libaom_test::ACMRandom::Rand8
                          ((ACMRandom *)
                           CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        local_298[local_2b4] = (ushort)bVar1;
      }
    }
    else {
      local_2aa = (short)(1 << ((byte)*(undefined4 *)(in_RDI + 0x34) & 0x1f)) - 1;
      for (local_2b0 = 0; local_2b0 < 0xa0; local_2b0 = local_2b0 + 1) {
        local_158[local_2b0] = local_2aa;
        local_298[local_2b0] = local_2aa;
      }
    }
    local_2b8 = 0x50;
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x512b4e);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbf0);
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x512b7a);
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x512bac);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbf0);
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x512bd8);
    for (local_308 = 0; local_308 < *(int *)(in_RDI + 0x28); local_308 = local_308 + 1) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                (&local_2d0,(long)(local_308 * 0x50 + *(int *)(in_RDI + 0x24)));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                (local_300,(long)(local_308 * 0x50 + *(int *)(in_RDI + 0x24)));
    }
    uVar6 = (uint)local_9;
    iVar3 = local_14;
    above_00 = local_2a0;
    puVar5 = local_2a8;
    this_00 = (DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
               *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x512cea);
    val = (char (*) [18])
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x512cff);
    in_stack_fffffffffffffbe0 = 0x50;
    Predict(this_00,SUB81((ulong)puVar5 >> 0x38,0),(int)puVar5,above_00,
            (unsigned_short *)CONCAT44(iVar3,uVar6),in_stack_fffffffffffffc70,
            (unsigned_short *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
            in_stack_fffffffffffffcc8);
    for (local_30c = 0; local_30c < *(int *)(in_RDI + 0x28); local_30c = local_30c + 1) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                (&local_2d0,(long)(local_30c * 0x50 + *(int *)(in_RDI + 0x24)));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                (local_300,(long)(local_30c * 0x50 + *(int *)(in_RDI + 0x24)));
    }
    for (local_310 = 0; local_310 < *(int *)(in_RDI + 0x28); local_310 = local_310 + 1) {
      for (local_314 = 0; local_314 < *(int *)(in_RDI + 0x24); local_314 = local_314 + 1) {
        in_stack_fffffffffffffc70 =
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&local_2d0,(long)(local_310 * 0x50 + local_314));
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  (local_300,(long)(local_310 * 0x50 + local_314));
        testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
                  ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8,
                   (unsigned_short *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
        if (!bVar2) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc10);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (int *)val);
          this_01 = (AssertHelper *)
                    testing::Message::operator<<
                              ((Message *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                               (char (*) [2])val);
          message = testing::Message::operator<<
                              ((Message *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                               (int *)val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (char (*) [5])val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (int *)val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (char (*) [5])val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (int *)val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (char (*) [6])val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (int *)val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (char (*) [6])val);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (int *)val);
          in_stack_fffffffffffffc10 =
               (AssertHelper *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                          val);
          pMVar4 = testing::Message::operator<<
                             ((Message *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              (int *)val);
          type = (Type)((ulong)pMVar4 >> 0x20);
          in_stack_fffffffffffffc00 =
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                          (char (*) [17])val);
          in_stack_fffffffffffffbf8 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                          (int *)val);
          in_stack_fffffffffffffbf0 =
               (allocator_type *)
               testing::AssertionResult::failure_message((AssertionResult *)0x51306f);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc10,type,(char *)in_stack_fffffffffffffc00,
                     (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                     (char *)in_stack_fffffffffffffbf0);
          testing::internal::AssertHelper::operator=(this_01,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          testing::Message::~Message((Message *)0x5130c9);
        }
        uVar6 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x51314d);
        if (uVar6 != 0) goto LAB_005131a4;
      }
    }
    uVar6 = 0;
LAB_005131a4:
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffbf0)
    ;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffbf0)
    ;
    if (uVar6 != 0) {
      return;
    }
    local_14 = local_14 + 1;
    in_stack_fffffffffffffcc4 = 0;
  } while( true );
}

Assistant:

void RunTest(bool speedtest, bool needsaturation, int p_angle) {
    bd_ = params_.bit_depth;

    for (int tx = 0; tx < TX_SIZES_ALL; ++tx) {
      bw_ = tx_size_wide[kTxSize[tx]];
      bh_ = tx_size_high[kTxSize[tx]];

      if (enable_upsample_) {
        upsample_above_ =
            av1_use_intra_edge_upsample(bw_, bh_, p_angle - 90, 0);
        upsample_left_ =
            av1_use_intra_edge_upsample(bw_, bh_, p_angle - 180, 0);
      } else {
        upsample_above_ = upsample_left_ = 0;
      }

      // Declare input buffers as local arrays to allow checking for
      // over-reads.
      DECLARE_ALIGNED(16, Pixel, left_data[kNumIntraNeighbourPixels]);
      DECLARE_ALIGNED(16, Pixel, above_data[kNumIntraNeighbourPixels]);

      // We need to allow reading some previous bytes from the input pointers.
      const Pixel *above = &above_data[kIntraPredInputPadding];
      const Pixel *left = &left_data[kIntraPredInputPadding];

      if (needsaturation) {
        const Pixel sat = (1 << bd_) - 1;
        for (int i = 0; i < kNumIntraNeighbourPixels; ++i) {
          left_data[i] = sat;
          above_data[i] = sat;
        }
      } else {
        for (int i = 0; i < kNumIntraNeighbourPixels; ++i) {
          left_data[i] = rng_.Rand8();
          above_data[i] = rng_.Rand8();
        }
      }

      // Add additional padding to allow detection of over reads/writes when
      // the transform width is equal to MAX_TX_SIZE.
      const int dst_stride = MAX_TX_SIZE + 16;
      std::vector<Pixel> dst_ref(dst_stride * bh_);
      std::vector<Pixel> dst_tst(dst_stride * bh_);

      for (int r = 0; r < bh_; ++r) {
        ASAN_POISON_MEMORY_REGION(&dst_ref[r * dst_stride + bw_],
                                  (dst_stride - bw_) * sizeof(Pixel));
        ASAN_POISON_MEMORY_REGION(&dst_tst[r * dst_stride + bw_],
                                  (dst_stride - bw_) * sizeof(Pixel));
      }

      Predict(speedtest, tx, above, left, dst_ref.data(), dst_tst.data(),
              dst_stride);

      for (int r = 0; r < bh_; ++r) {
        ASAN_UNPOISON_MEMORY_REGION(&dst_ref[r * dst_stride + bw_],
                                    (dst_stride - bw_) * sizeof(Pixel));
        ASAN_UNPOISON_MEMORY_REGION(&dst_tst[r * dst_stride + bw_],
                                    (dst_stride - bw_) * sizeof(Pixel));
      }

      for (int r = 0; r < bh_; ++r) {
        for (int c = 0; c < bw_; ++c) {
          ASSERT_EQ(dst_ref[r * dst_stride + c], dst_tst[r * dst_stride + c])
              << bw_ << "x" << bh_ << " r: " << r << " c: " << c
              << " dx: " << dx_ << " dy: " << dy_
              << " upsample_above: " << upsample_above_
              << " upsample_left: " << upsample_left_;
        }
      }
    }
  }